

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O2

void Am_Set_Timer_State(Am_Timer_State new_state)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Value *this;
  Am_Ptr pvVar4;
  Am_Time after;
  Am_Time before;
  Am_Time diff;
  Am_Value_List events;
  Am_Time AStack_58;
  Am_Time local_50;
  Am_Time local_48;
  Am_Time local_40;
  Am_Value_List local_38;
  
  am_clock();
  Am_Global_Timer_State = new_state;
  am_clock();
  pAVar2 = Am_Time::operator_cast_to_Am_Wrapper_(&local_50);
  pAVar3 = Am_Time::operator_cast_to_Am_Wrapper_(&AStack_58);
  if (pAVar2 != pAVar3) {
    Am_Time::operator-(&local_48,&AStack_58);
    Am_Value_List::Am_Value_List(&local_38,&am_timing_events);
    Am_Value_List::Start(&local_38);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_38);
      if (bVar1) break;
      this = Am_Value_List::Get(&local_38);
      pvVar4 = Am_Value::operator_cast_to_void_(this);
      Am_Time::operator+(&local_40,(Am_Time *)((long)pvVar4 + 0x18));
      Am_Time::operator=((Am_Time *)((long)pvVar4 + 0x18),&local_40);
      Am_Time::~Am_Time(&local_40);
      Am_Time::operator+(&local_40,(Am_Time *)((long)pvVar4 + 0x20));
      Am_Time::operator=((Am_Time *)((long)pvVar4 + 0x20),&local_40);
      Am_Time::~Am_Time(&local_40);
      Am_Value_List::Next(&local_38);
    }
    Am_Value_List::~Am_Value_List(&local_38);
    Am_Time::~Am_Time(&local_48);
  }
  Am_Time::~Am_Time(&AStack_58);
  Am_Time::~Am_Time(&local_50);
  return;
}

Assistant:

void
Am_Set_Timer_State(Am_Timer_State new_state)
{
  Am_Time before = am_clock();
  Am_Global_Timer_State = new_state;
  Am_Time after = am_clock();

  if (before != after) {
    // a discontinuity in the clock (caused by suspending and then resuming);
    // translate every timestamp on the queue to the new timeline
    Am_Time diff = after - before;

    Am_Interactor_Time_Event *next_event;
    Am_Value_List events = am_timing_events;
    for (events.Start(); !events.Last(); events.Next()) {
      next_event = (Am_Interactor_Time_Event *)(Am_Ptr)events.Get();
      next_event->next_timeout = next_event->next_timeout + diff;
      next_event->start_time = next_event->start_time + diff;
    }
  }
}